

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

int Bac_ObjGetRange(Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Bac_NameType_t BVar3;
  int local_18;
  int NameId;
  int i;
  int iObj_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjName(p,iObj);
  iVar2 = Bac_ObjIsCi(p,iObj);
  if (iVar2 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                  ,0xc6,"int Bac_ObjGetRange(Bac_Ntk_t *, int)");
  }
  BVar3 = Bac_NameType(iVar1);
  if ((BVar3 != BAC_NAME_WORD) && (BVar3 = Bac_NameType(iVar1), BVar3 != BAC_NAME_INFO)) {
    __assert_fail("Bac_NameType(NameId) == BAC_NAME_WORD || Bac_NameType(NameId) == BAC_NAME_INFO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacWriteVer.c"
                  ,0xc9,"int Bac_ObjGetRange(Bac_Ntk_t *, int)");
  }
  local_18 = iObj + 1;
  while (((iVar1 = Bac_NtkObjNum(p), local_18 < iVar1 &&
          (iVar1 = Bac_ObjIsCi(p,local_18), iVar1 != 0)) &&
         (BVar3 = Bac_ObjNameType(p,local_18), BVar3 == BAC_NAME_INDEX))) {
    local_18 = local_18 + 1;
  }
  return local_18 - iObj;
}

Assistant:

static inline int Bac_ObjGetRange( Bac_Ntk_t * p, int iObj )
{
    int i, NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
//    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
//        NameId = Bac_ObjName(p, iObj - Abc_Lit2Var2(NameId));
    assert( Bac_NameType(NameId) == BAC_NAME_WORD || Bac_NameType(NameId) == BAC_NAME_INFO );
    for ( i = iObj + 1; i < Bac_NtkObjNum(p); i++ )
        if ( !Bac_ObjIsCi(p, i) || Bac_ObjNameType(p, i) != BAC_NAME_INDEX )
            break;
    return i - iObj;
}